

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

size_t portability_path_get_directory_inplace(char *path,size_t size)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  
  if (path == (char *)0x0) {
    return 0;
  }
  cVar2 = *path;
  if (size == 0 || cVar2 == '\0') {
    uVar1 = 0;
  }
  else {
    uVar3 = 1;
    uVar1 = 0;
    do {
      if (cVar2 == '/') {
        uVar1 = uVar3;
      }
      if (size <= uVar3) break;
      cVar2 = path[uVar3];
      uVar3 = uVar3 + 1;
    } while (cVar2 != '\0');
  }
  path[uVar1] = '\0';
  return uVar1 + 1;
}

Assistant:

size_t portability_path_get_directory_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 0;
	}

	size_t i, last;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	path[last] = '\0';

	return last + 1;
}